

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_int64 UnixFile_Read(void *pUserData,void *pBuffer,jx9_int64 nDatatoRead)

{
  ssize_t nRd;
  jx9_int64 nDatatoRead_local;
  void *pBuffer_local;
  void *pUserData_local;
  
  pUserData_local = (void *)read((int)pUserData,pBuffer,nDatatoRead);
  if ((long)pUserData_local < 1) {
    pUserData_local = (void *)0xffffffffffffffff;
  }
  return (jx9_int64)pUserData_local;
}

Assistant:

static jx9_int64 UnixFile_Read(void *pUserData, void *pBuffer, jx9_int64 nDatatoRead)
{
	ssize_t nRd;
	nRd = read(SX_PTR_TO_INT(pUserData), pBuffer, (size_t)nDatatoRead);
	if( nRd < 1 ){
		/* EOF or IO error */
		return -1;
	}
	return (jx9_int64)nRd;
}